

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O0

void __thiscall cmCacheManager::PrintCache(cmCacheManager *this,ostream *out)

{
  const_iterator cVar1;
  bool bVar2;
  ostream *poVar3;
  reference ppVar4;
  _Self local_28;
  _Self local_20;
  const_iterator i;
  ostream *out_local;
  cmCacheManager *this_local;
  
  i._M_node = (_Base_ptr)out;
  poVar3 = std::operator<<(out,"=================================================");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)i._M_node,"CMakeCache Contents:");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>_>
       ::begin(&this->Cache);
  while( true ) {
    local_28._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>_>
         ::end(&this->Cache);
    bVar2 = std::operator!=(&local_20,&local_28);
    if (!bVar2) break;
    ppVar4 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>
             ::operator*(&local_20);
    cVar1 = i;
    if ((ppVar4->second).Type != INTERNAL) {
      ppVar4 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>
               ::operator*(&local_20);
      poVar3 = std::operator<<((ostream *)cVar1._M_node,(string *)ppVar4);
      poVar3 = std::operator<<(poVar3," = ");
      ppVar4 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>
               ::operator*(&local_20);
      poVar3 = std::operator<<(poVar3,(string *)&ppVar4->second);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>
    ::operator++(&local_20);
  }
  std::operator<<((ostream *)i._M_node,"\n\n");
  poVar3 = std::operator<<((ostream *)i._M_node,"To change values in the CMakeCache, ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::operator<<(poVar3,"edit CMakeCache.txt in your output directory.\n");
  poVar3 = std::operator<<((ostream *)i._M_node,"=================================================")
  ;
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void cmCacheManager::PrintCache(std::ostream& out) const
{
  out << "=================================================" << std::endl;
  out << "CMakeCache Contents:" << std::endl;
  for (std::map<std::string, CacheEntry>::const_iterator i =
         this->Cache.begin();
       i != this->Cache.end(); ++i) {
    if ((*i).second.Type != cmStateEnums::INTERNAL) {
      out << (*i).first << " = " << (*i).second.Value << std::endl;
    }
  }
  out << "\n\n";
  out << "To change values in the CMakeCache, " << std::endl
      << "edit CMakeCache.txt in your output directory.\n";
  out << "=================================================" << std::endl;
}